

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_int<unsigned_int,fmt::FormatSpec>
          (BasicWriter<char> *this,uint value,FormatSpec spec)

{
  undefined4 uVar1;
  uint uVar2;
  lconv *plVar3;
  size_t __n;
  CharPtr __dest;
  long lVar4;
  byte *pbVar5;
  CharPtr pcVar6;
  ulong uVar7;
  byte bVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ptrdiff_t _Num;
  undefined4 local_4c;
  long local_48;
  char *local_40;
  size_t local_38;
  
  uVar1 = spec._20_4_;
  uVar12 = (ulong)value;
  local_4c = 0;
  uVar13 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    bVar8 = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      bVar8 = 0x20;
    }
    local_4c = (uint)bVar8;
    uVar13 = 1;
  }
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_00126d61;
      if (spec.type_ == 'B') {
LAB_00126c84:
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar7 = (ulong)uVar13;
          *(undefined1 *)((long)&local_4c + uVar7) = 0x30;
          uVar13 = uVar13 | 2;
          *(char *)((long)&local_4c + uVar7 + 1) = spec.type_;
        }
        uVar14 = 0;
        uVar7 = uVar12;
        do {
          uVar14 = uVar14 + 1;
          uVar2 = (uint)uVar7;
          uVar7 = uVar7 >> 1;
        } while (1 < uVar2);
        pbVar5 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar14,&spec,(char *)&local_4c,uVar13);
        do {
          uVar13 = (uint)uVar12;
          *pbVar5 = (byte)uVar12 & 1 | 0x30;
          pbVar5 = pbVar5 + -1;
          uVar12 = uVar12 >> 1;
        } while (1 < uVar13);
        return;
      }
    }
    else {
      if (spec.type_ == 'X') goto LAB_00126cee;
      if (spec.type_ == 'b') goto LAB_00126c84;
    }
code_r0x00126e7a:
    internal::report_unknown_type(spec.super_AlignSpec.super_WidthSpec.fill_._3_1_,spec._8_8_);
  }
  if (0x6e < (byte)spec.type_) {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar7 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
        *(undefined1 *)((long)&local_4c + uVar7) = 0x30;
      }
      uVar14 = 0;
      uVar7 = uVar12;
      do {
        uVar14 = uVar14 + 1;
        uVar2 = (uint)uVar7;
        uVar7 = uVar7 >> 3;
      } while (7 < uVar2);
      pbVar5 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                 (this,uVar14,&spec,(char *)&local_4c,uVar13);
      do {
        uVar13 = (uint)uVar12;
        *pbVar5 = (byte)uVar12 & 7 | 0x30;
        pbVar5 = pbVar5 + -1;
        uVar12 = uVar12 >> 3;
      } while (7 < uVar13);
      return;
    }
    if (spec.type_ == 'x') {
LAB_00126cee:
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar7 = (ulong)uVar13;
        *(undefined1 *)((long)&local_4c + uVar7) = 0x30;
        uVar13 = uVar13 | 2;
        *(char *)((long)&local_4c + uVar7 + 1) = spec.type_;
      }
      uVar14 = 0;
      uVar7 = uVar12;
      do {
        uVar14 = uVar14 + 1;
        uVar2 = (uint)uVar7;
        uVar7 = uVar7 >> 4;
      } while (0xf < uVar2);
      pcVar6 = prepare_int_buffer<fmt::FormatSpec>(this,uVar14,&spec,(char *)&local_4c,uVar13);
      pcVar9 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar9 = "0123456789abcdef";
      }
      do {
        uVar13 = (uint)uVar12;
        *pcVar6 = pcVar9[uVar13 & 0xf];
        pcVar6 = pcVar6 + -1;
        uVar12 = uVar12 >> 4;
      } while (0xf < uVar13);
      return;
    }
    goto code_r0x00126e7a;
  }
  if (spec.type_ == 'd') {
LAB_00126d61:
    uVar14 = 0x1f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
      }
    }
    uVar14 = (uVar14 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    pcVar6 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar14 - (value < internal::BasicData<void>::POWERS_OF_10_32[uVar14]))
                             + 1,&spec,(char *)&local_4c,uVar13);
    pcVar6 = pcVar6 + 1;
    if (99 < value) {
      do {
        uVar13 = (uint)uVar12;
        value = (uint)(uVar12 / 100);
        uVar12 = uVar12 / 100;
        *(undefined2 *)(pcVar6 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(uVar13 + (int)uVar12 * -100) * 2);
        pcVar6 = pcVar6 + -2;
      } while (9999 < uVar13);
    }
    if (value < 10) {
      bVar8 = (byte)value | 0x30;
      lVar10 = -1;
    }
    else {
      pcVar6[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [((ulong)value * 2 & 0xffffffff) + 1];
      bVar8 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [(ulong)value * 2];
      lVar10 = -2;
    }
    pcVar6[lVar10] = bVar8;
    return;
  }
  if (spec.type_ != 'n') goto code_r0x00126e7a;
  uVar14 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
    }
  }
  uVar14 = (uVar14 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  plVar3 = localeconv();
  local_40 = plVar3->thousands_sep;
  __n = strlen(local_40);
  uVar14 = uVar14 - (value < internal::BasicData<void>::POWERS_OF_10_32[uVar14]);
  __dest = prepare_int_buffer<fmt::FormatSpec>
                     (this,uVar14 + (int)__n * (uVar14 / 3) + 1,&spec,(char *)&local_4c,uVar13);
  pcVar6 = __dest + 1;
  if (value < 100) {
    if (9 < value) {
      uVar12 = (ulong)(value * 2);
      *__dest = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [uVar12 + 1];
      goto LAB_00126eb0;
    }
  }
  else {
    lVar10 = -__n;
    uVar13 = 0;
    local_48 = lVar10;
    local_38 = __n;
    do {
      uVar2 = uVar13;
      uVar7 = uVar12;
      uVar14 = (uint)uVar7;
      uVar12 = uVar7 / 100;
      iVar11 = (int)(uVar7 / 100);
      uVar15 = (ulong)((uVar14 + iVar11 * -100) * 2);
      pcVar6[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [uVar15 + 1];
      if ((uVar2 | 1) * -0x55555555 < 0x55555556) {
        pcVar6 = pcVar6 + lVar10 + -1;
        if (__n == 0) {
          pcVar6[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [uVar15];
          lVar4 = 0;
          if ((uVar2 + 2) * -0x55555555 < 0x55555556) {
            lVar4 = lVar10;
          }
          pcVar6 = pcVar6 + lVar4 + -1;
        }
        else {
          memmove(pcVar6,local_40,__n);
          pcVar6[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [uVar15];
          pcVar6 = pcVar6 + -1;
          lVar10 = local_48;
          __n = local_38;
          if ((uVar2 + 2) * -0x55555555 < 0x55555556) {
            pcVar6 = pcVar6 + local_48;
            goto LAB_00126c00;
          }
        }
      }
      else {
        pcVar6[-2] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [uVar15];
        pcVar6 = pcVar6 + -2;
        if (((uVar2 + 2) * -0x55555555 < 0x55555556) && (pcVar6 = pcVar6 + lVar10, __n != 0)) {
LAB_00126c00:
          memmove(pcVar6,local_40,local_38);
          lVar10 = local_48;
          __n = local_38;
        }
      }
      uVar13 = uVar2 + 2;
    } while (9999 < uVar14);
    if (999 < uVar14) {
      uVar12 = (ulong)(uint)(iVar11 + (int)(uVar7 / 100));
      __dest = pcVar6 + -1;
      pcVar6[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [uVar12 + 1];
      if ((uVar2 * -0x55555555 + 1 < 0x55555556) && (__dest = __dest + -__n, __n != 0)) {
        memmove(__dest,local_40,__n);
      }
LAB_00126eb0:
      bVar8 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [uVar12];
      pcVar6 = __dest;
      goto LAB_00126ebc;
    }
  }
  bVar8 = (byte)uVar12 | 0x30;
LAB_00126ebc:
  pcVar6[-1] = bVar8;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}